

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * __thiscall
fmt::v6::internal::float_writer<char>::prettify<char*>(float_writer<char> *this,char *it)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  byte *__s;
  byte *pbVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  byte bVar12;
  ptrdiff_t _Num;
  ulong __n;
  bool bVar13;
  
  iVar2 = this->num_digits_;
  uVar8 = this->exp_ + iVar2;
  if ((this->specs_).field_0x4 == '\x01') {
    *it = *this->digits_;
    iVar2 = this->num_digits_;
    iVar3 = (this->specs_).precision;
    uVar10 = iVar3 - iVar2;
    bVar12 = (byte)(*(uint *)&(this->specs_).field_0x4 >> 0x15) & 1 &
             (uVar10 != 0 && iVar2 <= iVar3);
    if ((iVar2 < 2) && (bVar12 == 0)) {
      pcVar5 = it + 1;
    }
    else {
      it[1] = this->decimal_point_;
      pcVar5 = it + 2;
      iVar2 = this->num_digits_;
    }
    if (iVar2 != 1) {
      memmove(pcVar5,this->digits_ + 1,(long)iVar2 - 1U);
    }
    __s = (byte *)(pcVar5 + ((long)iVar2 - 1U));
    pbVar6 = __s;
    if (bVar12 != 0) {
      pbVar6 = __s + uVar10;
      memset(__s,0x30,(ulong)uVar10);
    }
    *pbVar6 = ((*(uint *)&(this->specs_).field_0x4 >> 0x10 & 1) == 0) << 5 | 0x45;
    pcVar5 = write_exponent<char,char*>(uVar8 - 1,(char *)(pbVar6 + 1));
    return pcVar5;
  }
  if (-1 < this->exp_) {
    if (iVar2 == 0) {
      iVar3 = 0;
    }
    else {
      memmove(it,this->digits_,(long)iVar2);
      iVar3 = this->num_digits_;
    }
    pcVar7 = it + iVar2;
    uVar10 = uVar8 - iVar3;
    pcVar5 = pcVar7;
    if (uVar10 != 0 && iVar3 <= (int)uVar8) {
      pcVar5 = pcVar7 + uVar10;
      memset(pcVar7,0x30,(ulong)uVar10);
    }
    if (((this->specs_).field_0x6 & 0x20) == 0) {
      return pcVar5;
    }
    pcVar7 = pcVar5 + 1;
    *pcVar5 = this->decimal_point_;
    iVar2 = (this->specs_).precision;
    uVar10 = iVar2 - uVar8;
    if (uVar10 != 0 && (int)uVar8 <= iVar2) {
      memset(pcVar7,0x30,(ulong)uVar10);
      return pcVar7 + uVar10;
    }
    if ((this->specs_).field_0x4 == '\x02') {
      return pcVar7;
    }
    pcVar5[1] = '0';
    return pcVar5 + 2;
  }
  if ((int)uVar8 < 1) {
    *it = '0';
    uVar9 = -uVar8;
    uVar10 = (this->specs_).precision;
    uVar1 = uVar9;
    if (SBORROW4(uVar10,uVar9) != (int)(uVar10 + uVar8) < 0) {
      uVar1 = uVar10;
    }
    if ((int)uVar10 < 0) {
      uVar1 = uVar9;
    }
    uVar8 = this->num_digits_;
    if (0 < (int)uVar8 && ((this->specs_).field_0x6 & 0x20) == 0) {
      do {
        if (this->digits_[(ulong)uVar8 - 1] != '0') goto LAB_0011e26c;
        bVar13 = 1 < (int)uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar13);
      uVar8 = 0;
    }
    if (uVar1 == 0 && uVar8 == 0) {
      return it + 1;
    }
LAB_0011e26c:
    it[1] = this->decimal_point_;
    pcVar7 = it + 2;
    pcVar5 = pcVar7;
    if (0 < (int)uVar1) {
      pcVar5 = pcVar7 + uVar1;
      memset(pcVar7,0x30,(ulong)uVar1);
    }
    if (uVar8 != 0) {
      memmove(pcVar5,this->digits_,(long)(int)uVar8);
    }
    return pcVar5 + (int)uVar8;
  }
  __n = (ulong)uVar8;
  memmove(it,this->digits_,__n);
  pcVar5 = it + __n;
  if (((this->specs_).field_0x6 & 0x20) != 0) {
    *pcVar5 = this->decimal_point_;
    sVar11 = (long)this->num_digits_ - __n;
    if (this->num_digits_ != uVar8) {
      memmove(pcVar5 + 1,this->digits_ + __n,sVar11);
      uVar8 = this->num_digits_;
    }
    pcVar5 = pcVar5 + 1 + sVar11;
    iVar2 = (this->specs_).precision;
    uVar10 = iVar2 - uVar8;
    if (uVar10 == 0 || iVar2 < (int)uVar8) {
      return pcVar5;
    }
    if (uVar10 == 0 || iVar2 < (int)uVar8) {
      return pcVar5;
    }
    memset(pcVar5,0x30,(ulong)uVar10);
    return pcVar5 + uVar10;
  }
  uVar4 = (ulong)(uint)this->num_digits_;
  if ((int)uVar8 < this->num_digits_) {
    do {
      if (this->digits_[uVar4 - 1] != '0') goto LAB_0011e30b;
      uVar4 = uVar4 - 1;
    } while ((long)__n < (long)uVar4);
  }
  else {
LAB_0011e30b:
    uVar10 = (uint)uVar4;
    bVar13 = uVar10 != uVar8;
    uVar8 = uVar10;
    if (bVar13) {
      *pcVar5 = this->decimal_point_;
      pcVar5 = pcVar5 + 1;
      sVar11 = (long)(int)uVar10 - __n;
      memmove(pcVar5,this->digits_ + __n,sVar11);
      goto LAB_0011e34f;
    }
  }
  sVar11 = (long)(int)uVar8 - __n;
LAB_0011e34f:
  return pcVar5 + sVar11;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }